

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O0

int __thiscall
Darts::DoubleArrayImpl<void,_void,_int,_void>::exactMatchSearch<int>
          (DoubleArrayImpl<void,_void,_int,_void> *this,key_type *key,size_t length,size_t node_pos)

{
  unit_type *puVar1;
  ulong uVar2;
  bool bVar3;
  id_type iVar4;
  value_type_conflict2 value;
  ulong local_40;
  size_t i;
  unit_type unit;
  int result;
  size_t node_pos_local;
  size_t length_local;
  key_type *key_local;
  DoubleArrayImpl<void,_void,_int,_void> *this_local;
  
  _unit = node_pos;
  set_result(this,(value_type_conflict2 *)((long)&i + 4),-1,0);
  i._0_4_ = this->array_[_unit].unit_;
  node_pos_local = length;
  if (length == 0) {
    for (; key[node_pos_local] != '\0'; node_pos_local = node_pos_local + 1) {
      iVar4 = Details::DoubleArrayUnit::offset((DoubleArrayUnit *)&i);
      _unit = (iVar4 ^ (byte)key[node_pos_local]) ^ _unit;
      i._0_4_ = this->array_[_unit].unit_;
      iVar4 = Details::DoubleArrayUnit::label((DoubleArrayUnit *)&i);
      if (iVar4 != (byte)key[node_pos_local]) {
        return i._4_4_;
      }
    }
  }
  else {
    for (local_40 = 0; local_40 < length; local_40 = local_40 + 1) {
      iVar4 = Details::DoubleArrayUnit::offset((DoubleArrayUnit *)&i);
      _unit = (iVar4 ^ (byte)key[local_40]) ^ _unit;
      i._0_4_ = this->array_[_unit].unit_;
      iVar4 = Details::DoubleArrayUnit::label((DoubleArrayUnit *)&i);
      if (iVar4 != (byte)key[local_40]) {
        return i._4_4_;
      }
    }
  }
  bVar3 = Details::DoubleArrayUnit::has_leaf((DoubleArrayUnit *)&i);
  uVar2 = _unit;
  if (bVar3) {
    puVar1 = this->array_;
    iVar4 = Details::DoubleArrayUnit::offset((DoubleArrayUnit *)&i);
    i._0_4_ = puVar1[uVar2 ^ iVar4].unit_;
    value = Details::DoubleArrayUnit::value((DoubleArrayUnit *)&i);
    set_result(this,(value_type_conflict2 *)((long)&i + 4),value,node_pos_local);
    this_local._4_4_ = i._4_4_;
  }
  else {
    this_local._4_4_ = i._4_4_;
  }
  return this_local._4_4_;
}

Assistant:

inline U DoubleArrayImpl<A, B, T, C>::exactMatchSearch(const key_type *key,
    std::size_t length, std::size_t node_pos) const {
  U result;
  set_result(&result, static_cast<value_type>(-1), 0);

  unit_type unit = array_[node_pos];
  if (length != 0) {
    for (std::size_t i = 0; i < length; ++i) {
      node_pos ^= unit.offset() ^ static_cast<uchar_type>(key[i]);
      unit = array_[node_pos];
      if (unit.label() != static_cast<uchar_type>(key[i])) {
        return result;
      }
    }
  } else {
    for ( ; key[length] != '\0'; ++length) {
      node_pos ^= unit.offset() ^ static_cast<uchar_type>(key[length]);
      unit = array_[node_pos];
      if (unit.label() != static_cast<uchar_type>(key[length])) {
        return result;
      }
    }
  }

  if (!unit.has_leaf()) {
    return result;
  }
  unit = array_[node_pos ^ unit.offset()];
  set_result(&result, static_cast<value_type>(unit.value()), length);
  return result;
}